

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureMultipleFailuresHelper>
               (XmlTestReporterFixtureMultipleFailuresHelper *testObject,TestDetails *details)

{
  XmlTestReporter *this;
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  undefined8 *puVar4;
  char *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  TestDetails failedDetails1;
  TestDetails local_4d0;
  TestDetails failedDetails2;
  SignalTranslator sig;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    TestDetails::TestDetails(&failedDetails1,"FailedTest","suite","fail.h",1);
    TestDetails::TestDetails(&failedDetails2,"FailedTest","suite","fail.h",0x1f);
    this = &(testObject->super_XmlTestReporterFixture).reporter;
    DeferredTestReporter::ReportTestStart(&this->super_DeferredTestReporter,&failedDetails1);
    DeferredTestReporter::ReportFailure
              (&this->super_DeferredTestReporter,&failedDetails1,"expected 1 but was 2");
    DeferredTestReporter::ReportFailure
              (&this->super_DeferredTestReporter,&failedDetails2,"expected one but was two");
    DeferredTestReporter::ReportTestFinish(&this->super_DeferredTestReporter,&failedDetails1,0.1);
    XmlTestReporter::ReportSummary(this,1,1,2,1.1);
    expected = 
    "<?xml version=\"1.0\"?><unittest-results tests=\"1\" failedtests=\"1\" failures=\"2\" time=\"1.1\"><test suite=\"suite\" name=\"FailedTest\" time=\"0.1\"><failure message=\"fail.h(1) : expected 1 but was 2\"/><failure message=\"fail.h(31) : expected one but was two\"/></test></unittest-results>"
    ;
    ppTVar3 = CurrentTest::Results();
    results = *ppTVar3;
    std::__cxx11::stringbuf::str();
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4d0,*ppTVar2,0xb4);
    CheckEqual<char_const*,std::__cxx11::string>(results,&expected,&local_510,&local_4d0);
    std::__cxx11::string::~string((string *)&local_510);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Unhandled system exception";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}